

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase1063::run(TestCase1063 *this)

{
  anon_class_8_1_7c961949 local_20;
  size_t local_18;
  size_t stackSize;
  TestCase1063 *this_local;
  
  stackSize = (size_t)this;
  local_20.stackSize = getSmallStackSize();
  local_18 = local_20.stackSize;
  (anonymous_namespace)::runWithStackLimit<kj::(anonymous_namespace)::TestCase1063::run()::__0>
            (local_20.stackSize,&local_20);
  return;
}

Assistant:

TEST(Async, LargeTaskSetDestructionExceptions) {
  size_t stackSize = getSmallStackSize();

  runWithStackLimit(stackSize, [stackSize]() {
    class ThrowingDestructor: public UnwindDetector {
    public:
      ~ThrowingDestructor() noexcept(false) {
        catchExceptionsIfUnwinding([]() {
          KJ_FAIL_ASSERT("ThrowingDestructor_exception");
        });
      }
    };
    ErrorHandlerImpl errorHandler;
    Maybe<TaskSet> tasks;
    TaskSet& tasksRef = tasks.emplace(errorHandler);

    for (int i = 0; i < stackSize / sizeof(void*); i++) {
      tasksRef.add(kj::Promise<void>(kj::NEVER_DONE).attach(kj::heap<ThrowingDestructor>()));
    }

    KJ_EXPECT_THROW_MESSAGE("ThrowingDestructor_exception", { tasks = kj::none; });
  });
}